

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libformula-calc.c
# Opt level: O2

void formula_free(rpf_t *rpf)

{
  rpf_t *prVar1;
  
  while (rpf != (rpf_t *)0x0) {
    if (rpf->type == TYPE_VALUE) {
      free(rpf->value);
    }
    prVar1 = rpf->next;
    free(rpf);
    rpf = prVar1;
  }
  return;
}

Assistant:

void formula_free(struct rpf_t *rpf)
{
  for (; rpf;)
  {
    struct rpf_t *tmp;
    switch (rpf->type)
    {
      case TYPE_VALUE:
        free(rpf->value);
        break;
      case TYPE_VARIABLE:
        break;
      default:
        break;
    }
    tmp = rpf->next;
    free(rpf);
    rpf = tmp;
  }
}